

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * parse_string_value(char **string)

{
  char *pcVar1;
  size_t *in_RDI;
  char *new_string;
  size_t new_string_len;
  JSON_Value *value;
  size_t length;
  char *string_00;
  char **in_stack_fffffffffffffff8;
  JSON_Value *pJVar2;
  
  string_00 = (char *)0x0;
  length = 0;
  pcVar1 = get_quoted_string(in_stack_fffffffffffffff8,in_RDI);
  if (pcVar1 == (char *)0x0) {
    pJVar2 = (JSON_Value *)0x0;
  }
  else {
    pJVar2 = json_value_init_string_no_copy(string_00,length);
    if (pJVar2 == (JSON_Value *)0x0) {
      (*parson_free)(pcVar1);
      pJVar2 = (JSON_Value *)0x0;
    }
  }
  return pJVar2;
}

Assistant:

static JSON_Value * parse_string_value(const char **string) {
    JSON_Value *value = NULL;
    size_t new_string_len = 0;
    char *new_string = get_quoted_string(string, &new_string_len);
    if (new_string == NULL) {
        return NULL;
    }
    value = json_value_init_string_no_copy(new_string, new_string_len);
    if (value == NULL) {
        parson_free(new_string);
        return NULL;
    }
    return value;
}